

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase90::run(TestCase90 *this)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  ArrayPtr<kj::String> argValues;
  TestObject *this_00;
  TestObject *this_01;
  DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
  *params;
  TestObject **params_00;
  TestObject **params_01;
  TestObject *ptrCopy;
  TestObject *ptrCopy_1;
  long lVar4;
  Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> OVar5;
  Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> obj2;
  Own<kj::(anonymous_namespace)::TestObject,_std::nullptr_t> obj1;
  DebugComparison<int,_int_&> _kjCondition_1;
  String local_a8;
  String local_90;
  DebugComparison<kj::(anonymous_namespace)::TestObject_*,_kj::(anonymous_namespace)::TestObject_*>
  _kjCondition;
  Arena arena;
  
  (anonymous_namespace)::TestObject::count = 0;
  (anonymous_namespace)::TestObject::throwAt = 0xffffffff;
  Arena::Arena(&arena,0x400);
  Arena::allocateOwn<kj::(anonymous_namespace)::TestObject>((Arena *)&obj1);
  OVar5 = Arena::allocateOwn<kj::(anonymous_namespace)::TestObject>((Arena *)&obj2);
  this_01 = obj1.ptr;
  this_00 = obj2.ptr;
  _kjCondition.result = obj1.ptr < obj2.ptr;
  _kjCondition.left = obj1.ptr;
  _kjCondition.right = obj2.ptr;
  _kjCondition.op.content.ptr = " < ";
  _kjCondition.op.content.size_ = 4;
  if (2 >= kj::_::Debug::minSeverity && !_kjCondition.result) {
    str<char_const(&)[45]>
              ((String *)&_kjCondition_1,(kj *)"failed: expected (obj1.get()) < (obj2.get())",
               (char (*) [45])
               CONCAT71(OVar5.ptr._1_7_,2 < kj::_::Debug::minSeverity || _kjCondition.result));
    str<kj::_::DebugComparison<kj::(anonymous_namespace)::TestObject*,kj::(anonymous_namespace)::TestObject*>&>
              ((String *)&_kjCondition_1.op.content.size_,(kj *)&_kjCondition,params);
    str<kj::(anonymous_namespace)::TestObject*&>(&local_a8,(kj *)this_01,params_00);
    str<kj::(anonymous_namespace)::TestObject*&>(&local_90,(kj *)this_00,params_01);
    argValues.size_ = (size_t)obj2.ptr;
    argValues.ptr = (String *)obj2.disposer;
    kj::_::Debug::logInternal
              ((Debug *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,(char *)0x63,2,0x4b73c4,(char *)&_kjCondition_1,argValues);
    lVar4 = 0x48;
    do {
      lVar1 = *(long *)((long)&_kjCondition_1.left + lVar4);
      if (lVar1 != 0) {
        uVar2 = *(undefined8 *)((long)&_kjCondition_1.right + lVar4);
        *(undefined8 *)((long)&_kjCondition_1.left + lVar4) = 0;
        *(undefined8 *)((long)&_kjCondition_1.right + lVar4) = 0;
        puVar3 = *(undefined8 **)((long)&_kjCondition_1.op.content.ptr + lVar4);
        (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0);
      }
      lVar4 = lVar4 + -0x18;
    } while (lVar4 != -0x18);
  }
  _kjCondition_1.result = (anonymous_namespace)::TestObject::count == 2;
  _kjCondition_1.left = 2;
  _kjCondition_1.right = &(anonymous_namespace)::TestObject::count;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  if ((!_kjCondition_1.result) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.left = (TestObject *)CONCAT44(_kjCondition.left._4_4_,2);
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x65,ERROR,
               "\"failed: expected \" \"(2) == (TestObject::count)\", _kjCondition, 2, TestObject::count"
               ,(char (*) [44])"failed: expected (2) == (TestObject::count)",&_kjCondition_1,
               (int *)&_kjCondition,&(anonymous_namespace)::TestObject::count);
  }
  if (this_00 != (TestObject *)0x0) {
    obj2.ptr = (TestObject *)0x0;
    (**(obj2.disposer)->_vptr_Disposer)(obj2.disposer,this_00);
  }
  if (this_01 != (TestObject *)0x0) {
    obj1.ptr = (TestObject *)0x0;
    (**(obj1.disposer)->_vptr_Disposer)(obj1.disposer,this_01);
  }
  _kjCondition_1.result = (anonymous_namespace)::TestObject::count == 0;
  _kjCondition_1.left = 0;
  _kjCondition_1.right = &(anonymous_namespace)::TestObject::count;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  if ((!_kjCondition_1.result) && (kj::_::Debug::minSeverity < 3)) {
    _kjCondition.left = (TestObject *)((ulong)_kjCondition.left & 0xffffffff00000000);
    kj::_::Debug::log<char_const(&)[44],kj::_::DebugComparison<int,int&>&,int,int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/arena-test.c++"
               ,0x68,ERROR,
               "\"failed: expected \" \"(0) == (TestObject::count)\", _kjCondition, 0, TestObject::count"
               ,(char (*) [44])"failed: expected (0) == (TestObject::count)",&_kjCondition_1,
               (int *)&_kjCondition,&(anonymous_namespace)::TestObject::count);
  }
  Arena::~Arena(&arena);
  return;
}

Assistant:

TEST(Arena, OwnObject) {
  TestObject::count = 0;
  TestObject::throwAt = -1;

  Arena arena;

  {
    Own<TestObject> obj1 = arena.allocateOwn<TestObject>();
    Own<TestObject> obj2 = arena.allocateOwn<TestObject>();
    EXPECT_LT(obj1.get(), obj2.get());

    EXPECT_EQ(2, TestObject::count);
  }

  EXPECT_EQ(0, TestObject::count);
}